

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  int *piVar1;
  REF_NODE pRVar2;
  REF_DBL *pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  bool bVar11;
  undefined8 uStackY_e0;
  REF_GRID_conflict ref_grid_2;
  REF_BOOL allowed_3;
  REF_MPI ref_mpi;
  REF_INT tri1;
  undefined4 uStack_a4;
  REF_BOOL allowed_1;
  REF_INT tri2;
  REF_GRID_conflict ref_grid;
  undefined8 uStack_90;
  
  uVar5 = ref_mpi_start(argc,argv);
  if (uVar5 != 0) {
    uVar8 = (ulong)uVar5;
    pcVar10 = "start";
    uStackY_e0 = 0x35;
LAB_0010d4d8:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
           ,uStackY_e0,"main",uVar8,pcVar10);
    return (int)uVar8;
  }
  uVar5 = ref_mpi_create(&ref_mpi);
  if (uVar5 != 0) {
    uVar8 = (ulong)uVar5;
    pcVar10 = "create";
    uStackY_e0 = 0x36;
    goto LAB_0010d4d8;
  }
  if (2 < argc) {
    uVar5 = ref_part_by_extension(&ref_grid,ref_mpi,argv[1]);
    if (uVar5 == 0) {
      ref_mpi_stopwatch_stop(ref_grid->mpi,"read grid");
      uVar5 = ref_part_metric(ref_grid->node,argv[2]);
      if (uVar5 == 0) {
        ref_mpi_stopwatch_stop(ref_grid->mpi,"read metric");
        if (argc != 3) {
          uVar5 = ref_egads_load(ref_grid->geom,argv[3]);
          if (uVar5 != 0) {
            uVar8 = (ulong)uVar5;
            pcVar10 = "load egads geom";
            uStackY_e0 = 0x40;
            goto LAB_0010d4d8;
          }
          ref_mpi_stopwatch_stop(ref_grid->mpi,"load geom");
        }
        uVar5 = ref_validation_cell_volume(ref_grid);
        if (uVar5 == 0) {
          uVar5 = ref_histogram_quality(ref_grid);
          if (uVar5 == 0) {
            uVar5 = ref_histogram_ratio(ref_grid);
            if (uVar5 == 0) {
              iVar9 = 5;
              ref_mpi_stopwatch_stop(ref_grid->mpi,"stats");
              while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
                uVar5 = ref_collapse_pass(ref_grid);
                if (uVar5 != 0) {
                  uVar8 = (ulong)uVar5;
                  pcVar10 = "col pass";
                  uStackY_e0 = 0x4a;
                  goto LAB_0010d4d8;
                }
                ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt col");
                uVar5 = ref_validation_cell_volume(ref_grid);
                if (uVar5 != 0) {
                  uVar8 = (ulong)uVar5;
                  pcVar10 = "vol";
                  uStackY_e0 = 0x4d;
                  goto LAB_0010d4d8;
                }
                uVar5 = ref_histogram_quality(ref_grid);
                if (uVar5 != 0) {
                  uVar8 = (ulong)uVar5;
                  pcVar10 = "gram";
                  uStackY_e0 = 0x4e;
                  goto LAB_0010d4d8;
                }
                uVar5 = ref_histogram_ratio(ref_grid);
                if (uVar5 != 0) {
                  uVar8 = (ulong)uVar5;
                  pcVar10 = "gram";
                  uStackY_e0 = 0x4f;
                  goto LAB_0010d4d8;
                }
                ref_mpi_stopwatch_stop(ref_grid->mpi,"stats");
              }
              uVar5 = ref_grid_free(ref_grid);
              if (uVar5 == 0) {
                uVar5 = ref_mpi_free(ref_mpi);
                if (uVar5 == 0) {
                  uVar5 = ref_mpi_stop();
                  if (uVar5 == 0) {
                    return 0;
                  }
                  uVar8 = (ulong)uVar5;
                  pcVar10 = "stop";
                  uStackY_e0 = 0x56;
                }
                else {
                  uVar8 = (ulong)uVar5;
                  pcVar10 = "free";
                  uStackY_e0 = 0x55;
                }
              }
              else {
                uVar8 = (ulong)uVar5;
                pcVar10 = "free";
                uStackY_e0 = 0x53;
              }
            }
            else {
              uVar8 = (ulong)uVar5;
              pcVar10 = "gram";
              uStackY_e0 = 0x46;
            }
          }
          else {
            uVar8 = (ulong)uVar5;
            pcVar10 = "gram";
            uStackY_e0 = 0x45;
          }
        }
        else {
          uVar8 = (ulong)uVar5;
          pcVar10 = "vol";
          uStackY_e0 = 0x44;
        }
      }
      else {
        uVar8 = (ulong)uVar5;
        pcVar10 = "get metric";
        uStackY_e0 = 0x3d;
      }
    }
    else {
      uVar8 = (ulong)uVar5;
      pcVar10 = "examine header";
      uStackY_e0 = 0x3b;
    }
    goto LAB_0010d4d8;
  }
  uVar5 = ref_fixture_tet_grid(&ref_grid,ref_mpi);
  if (uVar5 != 0) {
    uVar8 = (ulong)uVar5;
    pcVar10 = "set up";
    uStackY_e0 = 0x5e;
    goto LAB_0010d4d8;
  }
  uVar5 = ref_collapse_edge(ref_grid,0,3);
  if (uVar5 != 0) {
    uVar8 = (ulong)uVar5;
    pcVar10 = "collapse";
    uStackY_e0 = 0x62;
    goto LAB_0010d4d8;
  }
  lVar6 = (long)ref_grid->cell[8]->n;
  if (lVar6 == 0) {
    lVar6 = (long)ref_grid->cell[3]->n;
    if (lVar6 == 1) {
      lVar6 = (long)ref_grid->cell[0]->n;
      if (lVar6 == 1) {
        uVar5 = ref_grid_free(ref_grid);
        if (uVar5 != 0) {
          uVar8 = (ulong)uVar5;
          pcVar10 = "free grid";
          uStackY_e0 = 0x68;
          goto LAB_0010d4d8;
        }
        uVar5 = ref_fixture_tet_grid(&ref_grid_2,ref_mpi);
        if (uVar5 != 0) {
          uVar8 = (ulong)uVar5;
          pcVar10 = "set up";
          uStackY_e0 = 0x70;
          goto LAB_0010d4d8;
        }
        uVar5 = ref_collapse_edge(ref_grid_2,0,1);
        if (uVar5 != 0) {
          pcVar10 = "collapse";
          uStackY_e0 = 0x74;
          goto LAB_0010d8f2;
        }
        lVar6 = (long)ref_grid_2->cell[8]->n;
        if (lVar6 == 0) {
          lVar6 = (long)ref_grid_2->cell[3]->n;
          if (lVar6 == 0) {
            lVar6 = (long)ref_grid_2->cell[0]->n;
            if (lVar6 != 1) {
              pcVar10 = "edg";
              uVar7 = 0x78;
              uStackY_e0 = 1;
              goto LAB_0010da65;
            }
            uVar5 = ref_cell_nodes(ref_grid_2->cell[0],0,(REF_INT *)&ref_grid);
            if (uVar5 != 0) {
              pcVar10 = "nodes";
              uStackY_e0 = 0x7a;
              goto LAB_0010d8f2;
            }
            lVar6 = (long)(int)ref_grid;
            if (lVar6 == 0) {
              lVar6 = (long)ref_grid._4_4_;
              if (lVar6 != 2) {
                pcVar10 = "2";
                uStackY_e0 = 0x7c;
                uVar7 = uStackY_e0;
                uStackY_e0 = 2;
                goto LAB_0010da65;
              }
              uVar5 = ref_grid_free(ref_grid_2);
              if (uVar5 != 0) {
                uVar8 = (ulong)uVar5;
                pcVar10 = "free grid";
                uStackY_e0 = 0x7e;
                goto LAB_0010d4d8;
              }
              uVar5 = ref_fixture_tet_grid(&ref_grid,ref_mpi);
              if (uVar5 != 0) {
                uVar8 = (ulong)uVar5;
                pcVar10 = "set up";
                uStackY_e0 = 0x85;
                goto LAB_0010d4d8;
              }
              uVar5 = ref_collapse_edge(ref_grid,1,2);
              if (uVar5 != 0) {
                pcVar10 = "collapse";
                uStackY_e0 = 0x89;
                goto LAB_0010d8f2;
              }
              lVar6 = (long)ref_grid->cell[8]->n;
              if (lVar6 == 0) {
                lVar6 = (long)ref_grid->cell[3]->n;
                if (lVar6 == 0) {
                  lVar6 = (long)ref_grid->cell[0]->n;
                  if (lVar6 == 0) {
                    uVar5 = ref_grid_free(ref_grid);
                    if (uVar5 != 0) {
                      pcVar10 = "free grid";
                      uStackY_e0 = 0x8f;
LAB_0010d8f2:
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
                             ,uStackY_e0,"main",(ulong)uVar5,pcVar10);
                      return uVar5;
                    }
                    uVar5 = ref_fixture_tet_grid(&ref_grid,ref_mpi);
                    if (uVar5 != 0) {
                      pcVar10 = "set up";
                      uStackY_e0 = 0x96;
                      goto LAB_0010d8f2;
                    }
                    uVar5 = ref_collapse_edge(ref_grid,0,3);
                    if (uVar5 != 0) {
                      pcVar10 = "collapse";
                      uStackY_e0 = 0x9a;
                      goto LAB_0010d8f2;
                    }
                    pRVar2 = ref_grid->node;
                    lVar6 = (long)pRVar2->n;
                    if (lVar6 != 3) {
                      pcVar10 = "n";
                      uStackY_e0 = 3;
                      uVar7 = 0x9c;
                      goto LAB_0010da65;
                    }
                    if ((pRVar2->max < 4) || (pRVar2->global[3] < 0)) {
                      uVar5 = ref_grid_free(ref_grid);
                      if (uVar5 != 0) {
                        uVar8 = (ulong)uVar5;
                        pcVar10 = "free grid";
                        uStackY_e0 = 0x9f;
                        goto LAB_0010d4d8;
                      }
                      uVar5 = ref_fixture_tet_grid(&ref_grid_2,ref_mpi);
                      if (uVar5 != 0) {
                        uVar8 = (ulong)uVar5;
                        pcVar10 = "set up";
                        uStackY_e0 = 0xa7;
                        goto LAB_0010d4d8;
                      }
                      uVar5 = ref_collapse_edge(ref_grid_2,3,1);
                      if (uVar5 != 0) {
                        pcVar10 = "collapse";
                        uStackY_e0 = 0xab;
                        goto LAB_0010d8f2;
                      }
                      lVar6 = (long)ref_grid_2->cell[8]->n;
                      if (lVar6 == 0) {
                        lVar6 = (long)ref_grid_2->cell[3]->n;
                        if (lVar6 != 1) {
                          pcVar10 = "tri";
                          uStackY_e0 = 1;
                          uVar7 = 0xae;
                          goto LAB_0010da65;
                        }
                        lVar6 = (long)ref_grid_2->cell[0]->n;
                        if (lVar6 != 1) {
                          pcVar10 = "edg";
                          uStackY_e0 = 1;
                          uVar7 = 0xaf;
                          goto LAB_0010da65;
                        }
                        uVar5 = ref_cell_nodes(ref_grid_2->cell[3],0,(REF_INT *)&ref_grid);
                        if (uVar5 != 0) {
                          pcVar10 = "nodes";
                          uStackY_e0 = 0xb1;
                          goto LAB_0010d8f2;
                        }
                        lVar6 = (long)(int)ref_grid;
                        if (lVar6 == 0) {
                          lVar6 = (long)ref_grid._4_4_;
                          if (lVar6 != 3) {
                            pcVar10 = "1";
                            uStackY_e0 = 3;
                            uVar7 = 0xb3;
                            goto LAB_0010da65;
                          }
                          lVar6 = (long)(int)uStack_90;
                          if (lVar6 != 2) {
                            pcVar10 = "2";
                            uStackY_e0 = 2;
                            uVar7 = 0xb4;
                            goto LAB_0010da65;
                          }
                          uVar5 = ref_cell_nodes(ref_grid_2->cell[0],0,(REF_INT *)&ref_grid);
                          if (uVar5 != 0) {
                            pcVar10 = "nodes";
                            uStackY_e0 = 0xb6;
                            goto LAB_0010d8f2;
                          }
                          lVar6 = (long)(int)ref_grid;
                          if (lVar6 != 3) {
                            pcVar10 = "1";
                            uStackY_e0 = 3;
                            uVar7 = 0xb7;
                            goto LAB_0010da65;
                          }
                          lVar6 = (long)ref_grid._4_4_;
                          if (lVar6 != 2) {
                            pcVar10 = "2";
                            uStackY_e0 = 2;
                            uVar7 = 0xb8;
                            goto LAB_0010da65;
                          }
                          uVar5 = ref_grid_free(ref_grid_2);
                          if (uVar5 != 0) {
                            uVar8 = (ulong)uVar5;
                            pcVar10 = "free grid";
                            uStackY_e0 = 0xba;
                            goto LAB_0010d4d8;
                          }
                          uVar5 = ref_fixture_tet_grid(&ref_grid,ref_mpi);
                          if (uVar5 != 0) {
                            uVar8 = (ulong)uVar5;
                            pcVar10 = "set up";
                            uStackY_e0 = 0xc2;
                            goto LAB_0010d4d8;
                          }
                          uVar5 = ref_cell_remove(ref_grid->cell[3],0);
                          if (uVar5 != 0) {
                            uVar8 = (ulong)uVar5;
                            pcVar10 = "remove tri";
                            uStackY_e0 = 0xc3;
                            goto LAB_0010d4d8;
                          }
                          uVar5 = ref_collapse_edge_geometry(ref_grid,0,1,(REF_BOOL *)&ref_grid_2);
                          if (uVar5 != 0) {
                            pcVar10 = "col geom";
                            uStackY_e0 = 200;
                            goto LAB_0010d8f2;
                          }
                          lVar6 = (long)(int)ref_grid_2;
                          if (lVar6 != 1) {
                            pcVar10 = "interior edge allowed?";
                            uStackY_e0 = 1;
                            uVar7 = 0xca;
                            goto LAB_0010da65;
                          }
                          uVar5 = ref_grid_free(ref_grid);
                          if (uVar5 != 0) {
                            pcVar10 = "free grid";
                            uStackY_e0 = 0xcc;
                            goto LAB_0010d8f2;
                          }
                          uVar5 = ref_fixture_tet_grid(&ref_grid_2,ref_mpi);
                          if (uVar5 != 0) {
                            pcVar10 = "set up";
                            uStackY_e0 = 0x10a;
                            goto LAB_0010d8f2;
                          }
                          ref_grid = (REF_GRID_conflict)0x400000001;
                          uStack_90 = 0xa00000002;
                          uVar5 = ref_cell_add(ref_grid_2->cell[3],(REF_INT *)&ref_grid,&tri1);
                          if (uVar5 != 0) {
                            pcVar10 = "add tri";
                            uStackY_e0 = 0x116;
                            goto LAB_0010d8f2;
                          }
                          ref_grid = (REF_GRID_conflict)0x500000001;
                          uStack_90 = 0xa00000004;
                          uVar5 = ref_cell_add(ref_grid_2->cell[3],(REF_INT *)&ref_grid,&tri2);
                          if (uVar5 != 0) {
                            pcVar10 = "add tri";
                            uStackY_e0 = 0x11b;
                            goto LAB_0010d8f2;
                          }
                          uVar5 = ref_collapse_edge_geometry(ref_grid_2,0,3,&allowed_1);
                          if (uVar5 != 0) {
                            pcVar10 = "col geom";
                            uStackY_e0 = 0x120;
                            goto LAB_0010d8f2;
                          }
                          lVar6 = (long)allowed_1;
                          if (lVar6 != 1) {
                            pcVar10 = "interior node to face?";
                            uStackY_e0 = 1;
                            uVar7 = 0x121;
                            goto LAB_0010da65;
                          }
                          uVar5 = ref_collapse_edge_geometry(ref_grid_2,0,1,&allowed_1);
                          if (uVar5 != 0) {
                            pcVar10 = "col geom";
                            uStackY_e0 = 0x126;
                            goto LAB_0010d8f2;
                          }
                          lVar6 = (long)allowed_1;
                          if (lVar6 != 1) {
                            pcVar10 = "parallel and interior to face?";
                            uStackY_e0 = 1;
                            uVar7 = 0x127;
                            goto LAB_0010da65;
                          }
                          ref_grid_2->cell[3]->c2n
                          [(long)tri2 * (long)ref_grid_2->cell[3]->size_per + 3] = 0x14;
                          uVar5 = ref_collapse_edge_geometry(ref_grid_2,4,1,&allowed_1);
                          if (uVar5 != 0) {
                            pcVar10 = "col geom";
                            uStackY_e0 = 0x12e;
                            goto LAB_0010d8f2;
                          }
                          lVar6 = (long)allowed_1;
                          if (lVar6 != 1) {
                            pcVar10 = "parallel along geom edge?";
                            uStackY_e0 = 1;
                            uVar7 = 0x12f;
                            goto LAB_0010da65;
                          }
                          uVar5 = ref_grid_free(ref_grid_2);
                          if (uVar5 != 0) {
                            uVar8 = (ulong)uVar5;
                            pcVar10 = "free grid";
                            uStackY_e0 = 0x131;
                            goto LAB_0010d4d8;
                          }
                          uVar5 = ref_fixture_tet_grid(&ref_grid_2,ref_mpi);
                          if (uVar5 != 0) {
                            uVar8 = (ulong)uVar5;
                            pcVar10 = "set up";
                            uStackY_e0 = 0x13b;
                            goto LAB_0010d4d8;
                          }
                          uVar5 = ref_cell_remove(ref_grid_2->cell[3],0);
                          if (uVar5 != 0) {
                            uVar8 = (ulong)uVar5;
                            pcVar10 = "remove tri";
                            uStackY_e0 = 0x13c;
                            goto LAB_0010d4d8;
                          }
                          uVar5 = ref_geom_add(ref_grid_2->geom,1,0,0x19,(REF_DBL *)&ref_grid);
                          if (uVar5 != 0) {
                            uVar8 = (ulong)uVar5;
                            pcVar10 = "add node geom";
                            uStackY_e0 = 0x142;
                            goto LAB_0010d4d8;
                          }
                          uVar5 = ref_collapse_edge_geometry(ref_grid_2,0,1,&tri1);
                          if (uVar5 != 0) {
                            pcVar10 = "col geom";
                            uStackY_e0 = 0x147;
                            goto LAB_0010d8f2;
                          }
                          lVar6 = (long)tri1;
                          if (lVar6 == 0) {
                            uVar5 = ref_grid_free(ref_grid_2);
                            if (uVar5 != 0) {
                              uVar8 = (ulong)uVar5;
                              pcVar10 = "free grid";
                              uStackY_e0 = 0x14b;
                              goto LAB_0010d4d8;
                            }
                            uVar5 = ref_fixture_tet_grid((REF_GRID_conflict *)&tri1,ref_mpi);
                            if (uVar5 != 0) {
                              uVar8 = (ulong)uVar5;
                              pcVar10 = "set up";
                              uStackY_e0 = 0x157;
                              goto LAB_0010d4d8;
                            }
                            ref_grid = (REF_GRID_conflict)0x400000001;
                            uStack_90 = 0xa00000002;
                            uVar5 = ref_cell_add(*(REF_CELL *)(CONCAT44(uStack_a4,tri1) + 0x28),
                                                 (REF_INT *)&ref_grid,&tri2);
                            if (uVar5 != 0) {
                              uVar8 = (ulong)uVar5;
                              pcVar10 = "add tri";
                              uStackY_e0 = 0x163;
                              goto LAB_0010d4d8;
                            }
                            ref_grid = (REF_GRID_conflict)0x500000001;
                            uStack_90 = 0xa00000004;
                            uVar5 = ref_cell_add(*(REF_CELL *)(CONCAT44(uStack_a4,tri1) + 0x28),
                                                 (REF_INT *)&ref_grid,&allowed_1);
                            if (uVar5 != 0) {
                              uVar8 = (ulong)uVar5;
                              pcVar10 = "add tri";
                              uStackY_e0 = 0x168;
                              goto LAB_0010d4d8;
                            }
                            ref_grid_2 = (REF_GRID_conflict)0x3ff0000000000000;
                            uVar5 = ref_geom_add(*(REF_GEOM *)(CONCAT44(uStack_a4,tri1) + 0x98),1,1,
                                                 0x14,(REF_DBL *)&ref_grid_2);
                            if (uVar5 != 0) {
                              uVar8 = (ulong)uVar5;
                              pcVar10 = "add node geom";
                              uStackY_e0 = 0x16f;
                              goto LAB_0010d4d8;
                            }
                            ref_grid_2 = (REF_GRID_conflict)&DAT_4000000000000000;
                            uVar5 = ref_geom_add(*(REF_GEOM *)(CONCAT44(uStack_a4,tri1) + 0x98),2,1,
                                                 0x14,(REF_DBL *)&ref_grid_2);
                            if (uVar5 != 0) {
                              uVar8 = (ulong)uVar5;
                              pcVar10 = "add node geom";
                              uStackY_e0 = 0x175;
                              goto LAB_0010d4d8;
                            }
                            uVar5 = ref_collapse_edge_geometry
                                              ((REF_GRID)CONCAT44(uStack_a4,tri1),1,4,&allowed_3);
                            if (uVar5 != 0) {
                              pcVar10 = "col geom";
                              uStackY_e0 = 0x17b;
                              goto LAB_0010d8f2;
                            }
                            lVar6 = (long)allowed_3;
                            if (lVar6 != 1) {
                              pcVar10 = "pull to edge?";
                              uStackY_e0 = 1;
                              uVar7 = 0x17c;
                              goto LAB_0010da65;
                            }
                            uVar5 = ref_collapse_edge_geometry
                                              ((REF_GRID)CONCAT44(uStack_a4,tri1),4,1,&allowed_3);
                            if (uVar5 != 0) {
                              pcVar10 = "col geom";
                              uStackY_e0 = 0x181;
                              goto LAB_0010d8f2;
                            }
                            lVar6 = (long)allowed_3;
                            if (lVar6 == 0) {
                              uVar5 = ref_collapse_edge_geometry
                                                ((REF_GRID)CONCAT44(uStack_a4,tri1),1,2,&allowed_3);
                              if (uVar5 != 0) {
                                pcVar10 = "col geom";
                                uStackY_e0 = 0x187;
                                goto LAB_0010d8f2;
                              }
                              lVar6 = (long)allowed_3;
                              if (lVar6 != 1) {
                                pcVar10 = "parallel along geom edge?";
                                uStackY_e0 = 1;
                                uVar7 = 0x188;
                                goto LAB_0010da65;
                              }
                              uVar5 = ref_grid_free((REF_GRID)CONCAT44(uStack_a4,tri1));
                              if (uVar5 != 0) {
                                uVar8 = (ulong)uVar5;
                                pcVar10 = "free grid";
                                uStackY_e0 = 0x18a;
                                goto LAB_0010d4d8;
                              }
                              uVar5 = ref_fixture_tet_grid(&ref_grid_2,ref_mpi);
                              if (uVar5 != 0) {
                                uVar8 = (ulong)uVar5;
                                pcVar10 = "set up";
                                uStackY_e0 = 0x195;
                                goto LAB_0010d4d8;
                              }
                              uVar5 = ref_node_add(ref_grid_2->node,4,&tri1);
                              if (uVar5 != 0) {
                                uVar8 = (ulong)uVar5;
                                pcVar10 = "add node";
                                uStackY_e0 = 0x19e;
                                goto LAB_0010d4d8;
                              }
                              pRVar2 = ref_grid_2->node;
                              pRVar3 = pRVar2->real;
                              pRVar4 = pRVar3 + (long)tri1 * 0xf;
                              *pRVar4 = 1.0;
                              pRVar4[1] = 1.0;
                              pRVar3[(long)tri1 * 0xf + 2] = 0.0;
                              uVar5 = ref_node_add(pRVar2,5,&tri1);
                              if (uVar5 != 0) {
                                uVar8 = (ulong)uVar5;
                                pcVar10 = "add node";
                                uStackY_e0 = 0x1a3;
                                goto LAB_0010d4d8;
                              }
                              pRVar4 = ref_grid_2->node->real;
                              pRVar4[(long)tri1 * 0xf] = 2.0;
                              pRVar4 = pRVar4 + (long)tri1 * 0xf + 1;
                              *pRVar4 = 0.0;
                              pRVar4[1] = 0.0;
                              ref_grid = (REF_GRID_conflict)0x400000001;
                              uStack_90 = 0xa00000002;
                              uVar5 = ref_cell_add(ref_grid_2->cell[3],(REF_INT *)&ref_grid,&tri2);
                              if (uVar5 != 0) {
                                uVar8 = (ulong)uVar5;
                                pcVar10 = "add tri";
                                uStackY_e0 = 0x1ac;
                                goto LAB_0010d4d8;
                              }
                              ref_grid = (REF_GRID_conflict)0x500000001;
                              uStack_90 = 0xa00000004;
                              uVar5 = ref_cell_add(ref_grid_2->cell[3],(REF_INT *)&ref_grid,
                                                   &allowed_1);
                              if (uVar5 != 0) {
                                uVar8 = (ulong)uVar5;
                                pcVar10 = "add tri";
                                uStackY_e0 = 0x1b1;
                                goto LAB_0010d4d8;
                              }
                              uVar5 = ref_collapse_edge_same_normal(ref_grid_2,2,1,&allowed_3);
                              if (uVar5 != 0) {
                                pcVar10 = "norm";
                                uStackY_e0 = 0x1b6;
                                goto LAB_0010d8f2;
                              }
                              lVar6 = (long)allowed_3;
                              if (lVar6 != 1) {
                                pcVar10 = "normal will be the same";
                                uStackY_e0 = 1;
                                uVar7 = 0x1b7;
                                goto LAB_0010da65;
                              }
                              ref_grid_2->node->real[(long)tri1 * 0xf + 2] = 0.5;
                              uVar5 = ref_collapse_edge_same_normal(ref_grid_2,2,1,&allowed_3);
                              if (uVar5 != 0) {
                                pcVar10 = "norm";
                                uStackY_e0 = 0x1bc;
                                goto LAB_0010d8f2;
                              }
                              lVar6 = (long)allowed_3;
                              if (lVar6 == 0) {
                                pRVar3 = ref_grid_2->node->real;
                                pRVar4 = pRVar3 + (long)tri1 * 0xf;
                                *pRVar4 = 2.0;
                                pRVar4[1] = -1.0;
                                pRVar3[(long)tri1 * 0xf + 2] = 0.0;
                                uVar5 = ref_collapse_edge_same_normal(ref_grid_2,2,4,&allowed_3);
                                if (uVar5 != 0) {
                                  pcVar10 = "norm";
                                  uStackY_e0 = 0x1c6;
                                  goto LAB_0010d8f2;
                                }
                                lVar6 = (long)allowed_3;
                                if (lVar6 == 0) {
                                  uVar5 = ref_grid_free(ref_grid_2);
                                  if (uVar5 != 0) {
                                    uVar8 = (ulong)uVar5;
                                    pcVar10 = "free grid";
                                    uStackY_e0 = 0x1c9;
                                    goto LAB_0010d4d8;
                                  }
                                  uVar5 = ref_fixture_tet_grid(&ref_grid,ref_mpi);
                                  if (uVar5 != 0) {
                                    uVar8 = (ulong)uVar5;
                                    pcVar10 = "set up";
                                    uStackY_e0 = 0x1d1;
                                    goto LAB_0010d4d8;
                                  }
                                  uVar5 = ref_collapse_edge_mixed
                                                    (ref_grid,0,1,(REF_BOOL *)&ref_grid_2);
                                  if (uVar5 != 0) {
                                    pcVar10 = "col mixed";
                                    uStackY_e0 = 0x1d5;
                                    goto LAB_0010d8f2;
                                  }
                                  lVar6 = (long)(int)ref_grid_2;
                                  if (lVar6 != 1) {
                                    pcVar10 = "pure tet allowed?";
                                    uStackY_e0 = 1;
                                    uVar7 = 0x1d7;
                                    goto LAB_0010da65;
                                  }
                                  uVar5 = ref_grid_free(ref_grid);
                                  if (uVar5 != 0) {
                                    pcVar10 = "free grid";
                                    uStackY_e0 = 0x1d9;
                                    goto LAB_0010d8f2;
                                  }
                                  uVar5 = ref_fixture_pri_tet_cap_grid(&ref_grid,ref_mpi);
                                  if (uVar5 != 0) {
                                    pcVar10 = "set up";
                                    uStackY_e0 = 0x1e0;
                                    goto LAB_0010d8f2;
                                  }
                                  uVar5 = ref_collapse_edge_mixed
                                                    (ref_grid,5,6,(REF_BOOL *)&ref_grid_2);
                                  if (uVar5 != 0) {
                                    pcVar10 = "col mixed";
                                    uStackY_e0 = 0x1e4;
                                    goto LAB_0010d8f2;
                                  }
                                  lVar6 = (long)(int)ref_grid_2;
                                  if (lVar6 != 1) {
                                    pcVar10 = "tet near mixed allowed?";
                                    uStackY_e0 = 1;
                                    uVar7 = 0x1e5;
                                    goto LAB_0010da65;
                                  }
                                  uVar5 = ref_collapse_edge_mixed
                                                    (ref_grid,6,5,(REF_BOOL *)&ref_grid_2);
                                  if (uVar5 != 0) {
                                    pcVar10 = "col mixed";
                                    uStackY_e0 = 0x1e9;
                                    goto LAB_0010d8f2;
                                  }
                                  lVar6 = (long)(int)ref_grid_2;
                                  if (lVar6 == 0) {
                                    uVar5 = ref_collapse_edge_mixed
                                                      (ref_grid,3,4,(REF_BOOL *)&ref_grid_2);
                                    if (uVar5 != 0) {
                                      pcVar10 = "col mixed";
                                      uStackY_e0 = 0x1ee;
                                      goto LAB_0010d8f2;
                                    }
                                    lVar6 = (long)(int)ref_grid_2;
                                    if (lVar6 == 0) {
                                      uVar5 = ref_grid_free(ref_grid);
                                      if (uVar5 != 0) {
                                        uVar8 = (ulong)uVar5;
                                        pcVar10 = "free grid";
                                        uStackY_e0 = 0x1f1;
                                        goto LAB_0010d4d8;
                                      }
                                      uVar5 = ref_fixture_tet_grid(&ref_grid,ref_mpi);
                                      if (uVar5 != 0) {
                                        uVar8 = (ulong)uVar5;
                                        pcVar10 = "set up";
                                        uStackY_e0 = 0x1f9;
                                        goto LAB_0010d4d8;
                                      }
                                      uVar5 = ref_collapse_edge_local_cell
                                                        (ref_grid,0,1,(REF_BOOL *)&ref_grid_2);
                                      if (uVar5 != 0) {
                                        pcVar10 = "col loc";
                                        uStackY_e0 = 0x1fe;
                                        goto LAB_0010d8f2;
                                      }
                                      lVar6 = (long)(int)ref_grid_2;
                                      if (lVar6 != 1) {
                                        pcVar10 = "local collapse allowed?";
                                        uStackY_e0 = 1;
                                        uVar7 = 0x1ff;
                                        goto LAB_0010da65;
                                      }
                                      piVar1 = ref_grid->node->part + 2;
                                      *piVar1 = *piVar1 + 1;
                                      uVar5 = ref_collapse_edge_local_cell
                                                        (ref_grid,0,1,(REF_BOOL *)&ref_grid_2);
                                      if (uVar5 != 0) {
                                        pcVar10 = "col loc";
                                        uStackY_e0 = 0x207;
                                        goto LAB_0010d8f2;
                                      }
                                      lVar6 = (long)(int)ref_grid_2;
                                      if (lVar6 == 0) {
                                        uVar5 = ref_grid_free(ref_grid);
                                        if (uVar5 != 0) {
                                          pcVar10 = "free grid";
                                          uStackY_e0 = 0x20a;
                                          goto LAB_0010d8f2;
                                        }
                                        uVar5 = ref_fixture_tet_grid(&ref_grid,ref_mpi);
                                        if (uVar5 != 0) {
                                          pcVar10 = "set up";
                                          uStackY_e0 = 0x210;
                                          goto LAB_0010d8f2;
                                        }
                                        uVar5 = ref_collapse_pass(ref_grid);
                                        if (uVar5 != 0) {
                                          pcVar10 = "pass";
                                          uStackY_e0 = 0x212;
                                          goto LAB_0010d8f2;
                                        }
                                        lVar6 = (long)ref_grid->node->n;
                                        if (lVar6 != 4) {
                                          pcVar10 = "nodes";
                                          uStackY_e0 = 4;
                                          uVar7 = 0x214;
                                          goto LAB_0010da65;
                                        }
                                        lVar6 = (long)ref_grid->cell[8]->n;
                                        if (lVar6 != 1) {
                                          pcVar10 = "tets";
                                          uStackY_e0 = 1;
                                          uVar7 = 0x215;
                                          goto LAB_0010da65;
                                        }
                                        uVar5 = ref_grid_free(ref_grid);
                                        if (uVar5 != 0) {
                                          pcVar10 = "free grid";
                                          uStackY_e0 = 0x217;
                                          goto LAB_0010d8f2;
                                        }
                                        uVar5 = ref_fixture_tet_grid(&ref_grid,ref_mpi);
                                        if (uVar5 != 0) {
                                          pcVar10 = "set up";
                                          uStackY_e0 = 0x21d;
                                          goto LAB_0010d8f2;
                                        }
                                        uVar5 = ref_node_metric_form
                                                          (ref_grid->node,3,1.0,0.0,0.0,1.0,0.0,0.01
                                                          );
                                        if (uVar5 != 0) {
                                          pcVar10 = "set top z big";
                                          uStackY_e0 = 0x221;
                                          goto LAB_0010d8f2;
                                        }
                                        uVar5 = ref_collapse_pass(ref_grid);
                                        if (uVar5 != 0) {
                                          pcVar10 = "pass";
                                          uStackY_e0 = 0x223;
                                          goto LAB_0010d8f2;
                                        }
                                        lVar6 = (long)ref_grid->node->n;
                                        if (lVar6 != 3) {
                                          pcVar10 = "nodes";
                                          uStackY_e0 = 3;
                                          uVar7 = 0x227;
                                          goto LAB_0010da65;
                                        }
                                        lVar6 = (long)ref_grid->cell[8]->n;
                                        if (lVar6 == 0) {
                                          uVar5 = ref_grid_free(ref_grid);
                                          if (uVar5 != 0) {
                                            pcVar10 = "free grid";
                                            uStackY_e0 = 0x22a;
                                            goto LAB_0010d8f2;
                                          }
                                          uVar5 = ref_fixture_tri2_grid(&ref_grid,ref_mpi);
                                          if (uVar5 != 0) {
                                            pcVar10 = "set up";
                                            uStackY_e0 = 0x232;
                                            goto LAB_0010d8f2;
                                          }
                                          uVar5 = ref_collapse_edge_same_tangent
                                                            (ref_grid,2,0,(REF_BOOL *)&ref_grid_2);
                                          if (uVar5 != 0) {
                                            pcVar10 = "same";
                                            uStackY_e0 = 0x237;
                                            goto LAB_0010d8f2;
                                          }
                                          lVar6 = (long)(int)ref_grid_2;
                                          if (lVar6 != 1) {
                                            pcVar10 = "straight tangent collapse allowed?";
                                            uStackY_e0 = 1;
                                            uVar7 = 0x238;
                                            goto LAB_0010da65;
                                          }
                                          ref_grid->node->real[1] = 0.5;
                                          uVar5 = ref_collapse_edge_same_tangent
                                                            (ref_grid,2,0,(REF_BOOL *)&ref_grid_2);
                                          if (uVar5 != 0) {
                                            pcVar10 = "same";
                                            uStackY_e0 = 0x23d;
                                            goto LAB_0010d8f2;
                                          }
                                          lVar6 = (long)(int)ref_grid_2;
                                          if (lVar6 == 0) {
                                            uVar5 = ref_grid_free(ref_grid);
                                            if (uVar5 != 0) {
                                              pcVar10 = "free grid";
                                              uStackY_e0 = 0x240;
                                              goto LAB_0010d8f2;
                                            }
                                            uVar5 = ref_fixture_tri_grid(&ref_grid,ref_mpi);
                                            if (uVar5 != 0) {
                                              pcVar10 = "set up";
                                              uStackY_e0 = 0x246;
                                              goto LAB_0010d8f2;
                                            }
                                            uVar5 = ref_collapse_pass(ref_grid);
                                            if (uVar5 != 0) {
                                              pcVar10 = "pass";
                                              uStackY_e0 = 0x248;
                                              goto LAB_0010d8f2;
                                            }
                                            lVar6 = (long)ref_grid->cell[3]->n;
                                            if (lVar6 != 1) {
                                              pcVar10 = "tri";
                                              uStackY_e0 = 1;
                                              uVar7 = 0x24a;
                                              goto LAB_0010da65;
                                            }
                                            lVar6 = (long)ref_grid->cell[6]->n;
                                            if (lVar6 == 0) {
                                              uVar5 = ref_grid_free(ref_grid);
                                              if (uVar5 != 0) {
                                                uVar8 = (ulong)uVar5;
                                                pcVar10 = "free grid";
                                                uStackY_e0 = 0x24d;
                                                goto LAB_0010d4d8;
                                              }
                                              uVar5 = ref_fixture_tri_grid(&ref_grid,ref_mpi);
                                              if (uVar5 != 0) {
                                                uVar8 = (ulong)uVar5;
                                                pcVar10 = "set up";
                                                uStackY_e0 = 0x253;
                                                goto LAB_0010d4d8;
                                              }
                                              uVar5 = ref_node_metric_form
                                                                (ref_grid->node,1,1.0,0.0,0.0,0.01,
                                                                 0.0,1.0);
                                              if (uVar5 != 0) {
                                                pcVar10 = "set top z big";
                                                uStackY_e0 = 599;
                                                goto LAB_0010d8f2;
                                              }
                                              uVar5 = ref_collapse_pass(ref_grid);
                                              if (uVar5 != 0) {
                                                pcVar10 = "pass";
                                                uStackY_e0 = 0x259;
                                                goto LAB_0010d8f2;
                                              }
                                              lVar6 = (long)ref_grid->node->n;
                                              if (lVar6 != 2) {
                                                pcVar10 = "nodes";
                                                uStackY_e0 = 2;
                                                uVar7 = 0x25b;
                                                goto LAB_0010da65;
                                              }
                                              lVar6 = (long)ref_grid->cell[3]->n;
                                              if (lVar6 == 0) {
                                                lVar6 = (long)ref_grid->cell[10]->n;
                                                if (lVar6 == 0) {
                                                  uVar5 = ref_grid_free(ref_grid);
                                                  if (uVar5 == 0) {
                                                    uVar5 = ref_mpi_free(ref_mpi);
                                                    if (uVar5 == 0) {
                                                      uVar5 = ref_mpi_stop();
                                                      if (uVar5 == 0) {
                                                        return 0;
                                                      }
                                                      uVar8 = (ulong)uVar5;
                                                      pcVar10 = "stop";
                                                      uStackY_e0 = 0x263;
                                                    }
                                                    else {
                                                      uVar8 = (ulong)uVar5;
                                                      pcVar10 = "free";
                                                      uStackY_e0 = 0x262;
                                                    }
                                                  }
                                                  else {
                                                    uVar8 = (ulong)uVar5;
                                                    pcVar10 = "free grid";
                                                    uStackY_e0 = 0x25f;
                                                  }
                                                  goto LAB_0010d4d8;
                                                }
                                                pcVar10 = "pri";
                                                uStackY_e0 = 0x25d;
                                              }
                                              else {
                                                pcVar10 = "tri";
                                                uStackY_e0 = 0x25c;
                                              }
                                            }
                                            else {
                                              pcVar10 = "qua";
                                              uStackY_e0 = 0x24b;
                                            }
                                          }
                                          else {
                                            pcVar10 = "curved boundary collapse allowed?";
                                            uStackY_e0 = 0x23e;
                                          }
                                        }
                                        else {
                                          pcVar10 = "tets";
                                          uStackY_e0 = 0x228;
                                        }
                                      }
                                      else {
                                        pcVar10 = "ghost collapse allowed?";
                                        uStackY_e0 = 0x208;
                                      }
                                    }
                                    else {
                                      pcVar10 = "mixed collapse allowed?";
                                      uStackY_e0 = 0x1ef;
                                    }
                                  }
                                  else {
                                    pcVar10 = "tet changing mixed allowed?";
                                    uStackY_e0 = 0x1ea;
                                  }
                                }
                                else {
                                  pcVar10 = "tri will have zero area";
                                  uStackY_e0 = 0x1c7;
                                }
                              }
                              else {
                                pcVar10 = "normal would change";
                                uStackY_e0 = 0x1bd;
                              }
                            }
                            else {
                              pcVar10 = "pull off edge?";
                              uStackY_e0 = 0x182;
                            }
                          }
                          else {
                            pcVar10 = "interior edge allowed?";
                            uStackY_e0 = 0x149;
                          }
                        }
                        else {
                          pcVar10 = "0";
                          uStackY_e0 = 0xb2;
                        }
                      }
                      else {
                        pcVar10 = "tet";
                        uStackY_e0 = 0xad;
                      }
                    }
                    else {
                      lVar6 = 1;
                      pcVar10 = "val";
                      uStackY_e0 = 0x9d;
                    }
                  }
                  else {
                    pcVar10 = "edg";
                    uStackY_e0 = 0x8d;
                  }
                }
                else {
                  pcVar10 = "tri";
                  uStackY_e0 = 0x8c;
                }
              }
              else {
                pcVar10 = "tet";
                uStackY_e0 = 0x8b;
              }
            }
            else {
              pcVar10 = "1";
              uStackY_e0 = 0x7b;
            }
          }
          else {
            pcVar10 = "tri";
            uStackY_e0 = 0x77;
          }
        }
        else {
          pcVar10 = "tet";
          uStackY_e0 = 0x76;
        }
        uVar7 = uStackY_e0;
        uStackY_e0 = 0;
LAB_0010da65:
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c"
               ,uVar7,"main",pcVar10,uStackY_e0,lVar6);
        return 1;
      }
      pcVar10 = "edg";
      uStackY_e0 = 0x66;
    }
    else {
      pcVar10 = "tri";
      uStackY_e0 = 0x65;
    }
    uVar7 = 1;
  }
  else {
    pcVar10 = "tet";
    uStackY_e0 = 100;
    uVar7 = 0;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse_test.c",
         uStackY_e0,"main",pcVar10,uVar7,lVar6);
  return 1;
}

Assistant:

int main(int argc, char *argv[]) {
  REF_MPI ref_mpi;
  RSS(ref_mpi_start(argc, argv), "start");
  RSS(ref_mpi_create(&ref_mpi), "create");

  if (argc > 2) {
    REF_GRID ref_grid;
    REF_INT pass;
    RSS(ref_part_by_extension(&ref_grid, ref_mpi, argv[1]), "examine header");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "read grid");
    RSS(ref_part_metric(ref_grid_node(ref_grid), argv[2]), "get metric");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "read metric");
    if (argc > 3) {
      RSS(ref_egads_load(ref_grid_geom(ref_grid), argv[3]), "load egads geom");
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "load geom");
    }

    RSS(ref_validation_cell_volume(ref_grid), "vol");
    RSS(ref_histogram_quality(ref_grid), "gram");
    RSS(ref_histogram_ratio(ref_grid), "gram");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "stats");

    for (pass = 0; pass < 5; pass++) {
      RSS(ref_collapse_pass(ref_grid), "col pass");
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt col");

      RSS(ref_validation_cell_volume(ref_grid), "vol");
      RSS(ref_histogram_quality(ref_grid), "gram");
      RSS(ref_histogram_ratio(ref_grid), "gram");
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "stats");
    }

    RSS(ref_grid_free(ref_grid), "free");

    RSS(ref_mpi_free(ref_mpi), "free");
    RSS(ref_mpi_stop(), "stop");
    return 0;
  }

  { /* collapse tet into triangle, keep renumbered edge */
    REF_GRID ref_grid;
    REF_INT node0, node1;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 0;
    node1 = 3;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tet");
    REIS(1, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(1, ref_cell_n(ref_grid_edg(ref_grid)), "edg");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* collapse tet into nothing, keep edge */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_INT nodes[REF_CELL_MAX_SIZE_PER];

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 0;
    node1 = 1;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tet");
    REIS(0, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(1, ref_cell_n(ref_grid_edg(ref_grid)), "edg");

    RSS(ref_cell_nodes(ref_grid_edg(ref_grid), 0, nodes), "nodes");
    REIS(0, nodes[0], "1");
    REIS(2, nodes[1], "2");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* collapse tet into nothing, no more edge */
    REF_GRID ref_grid;
    REF_INT node0, node1;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 1;
    node1 = 2;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tet");
    REIS(0, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(0, ref_cell_n(ref_grid_edg(ref_grid)), "edg");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* collapse removes node */
    REF_GRID ref_grid;
    REF_INT node0, node1;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 0;
    node1 = 3;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(3, ref_node_n(ref_grid_node(ref_grid)), "n");
    REIS(REF_FALSE, ref_node_valid(ref_grid_node(ref_grid), 3), "val");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* collapse tet, renumber triangle, renumber edge */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_INT nodes[REF_CELL_MAX_SIZE_PER];

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    node0 = 3;
    node1 = 1;

    RSS(ref_collapse_edge(ref_grid, node0, node1), "collapse");

    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tet");
    REIS(1, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(1, ref_cell_n(ref_grid_edg(ref_grid)), "edg");

    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), 0, nodes), "nodes");
    REIS(0, nodes[0], "0");
    REIS(3, nodes[1], "1");
    REIS(2, nodes[2], "2");

    RSS(ref_cell_nodes(ref_grid_edg(ref_grid), 0, nodes), "nodes");
    REIS(3, nodes[0], "1");
    REIS(2, nodes[1], "2");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* geometry: collapse of volume node? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    RSS(ref_cell_remove(ref_grid_tri(ref_grid), 0), "remove tri");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");

    REIS(REF_TRUE, allowed, "interior edge allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  /*
         /  6252 \
     6253    e    5936
         /  6251 \
     6559    c    5937
      \   \  5938 /  |
        \     |   \ 6252r
          \  6560 /

start 6251 5938
remove cell 12781 nodes 6251 6559 5938  id 1186
remove cell 12154 nodes 5937 6251 5938  id 1186
old cell 12783 nodes 6560 6252 5938  id 1186
new cell 12783 nodes 6560 6252 6251  id 1186
old cell 12787 nodes 6559 6560 5938  id 1186
new cell 12787 nodes 6559 6560 6251  id 1186
old cell 12155 nodes 6252 5937 5938  id 1186
new cell 12155 nodes 6252 5937 6251  id 1186

quad 6251 6252
replaced
 item 0 cell 12155 nodes 6252 5937 6251 id 1186
 item 1 cell 12783 nodes 6560 6252 6251 id 1186
existing
 item 2 cell 12150 nodes 6252 6251 5936 id 1191
 item 3 cell 12780 nodes 6251 6252 6253 id 1192


  {
    REF_GRID ref_grid;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_grid_create(&ref_grid, ref_mpi), "set up");
    nodes[0] = 6251;
    nodes[1] = 6251;
    nodes[2] = 6251;
    nodes[3] = 6251;

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");

    REIS(REF_TRUE, allowed, "interior edge allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

   */

  { /* geometry: collapse allowed on face? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_INT nodes[4];
    REF_INT tri1, tri2;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    /*
    2---4
    |\ 1|\
    |0\ | \
    |  \|2 \
    0---1---5
    */
    nodes[0] = 1;
    nodes[1] = 4;
    nodes[2] = 2;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri1), "add tri");
    nodes[0] = 1;
    nodes[1] = 5;
    nodes[2] = 4;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri2), "add tri");

    node0 = 0;
    node1 = 3;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "interior node to face?");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "parallel and interior to face?");

    ref_cell_c2n(ref_grid_tri(ref_grid), 3, tri2) = 20;

    node0 = 4;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "parallel along geom edge?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* geometry: collapse of geom node? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;
    REF_INT node, type, id;
    REF_DBL params[2];

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    RSS(ref_cell_remove(ref_grid_tri(ref_grid), 0), "remove tri");

    node = 1;
    type = REF_GEOM_NODE;
    id = 25;
    RSS(ref_geom_add(ref_grid_geom(ref_grid), node, type, id, params),
        "add node geom");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");

    REIS(REF_FALSE, allowed, "interior edge allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* geometry: collapse allowed on edge with jump? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_INT nodes[4];
    REF_INT tri1, tri2;
    REF_BOOL allowed;
    REF_INT node, type, id;
    REF_DBL params[2];

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    /*
    2---4
    |\ 1|\
    |0\ | \   edge 20, 1-2
    |  \|2 \  face all 10
    0---1---5
    */
    nodes[0] = 1;
    nodes[1] = 4;
    nodes[2] = 2;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri1), "add tri");
    nodes[0] = 1;
    nodes[1] = 5;
    nodes[2] = 4;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri2), "add tri");

    node = 1;
    type = REF_GEOM_EDGE;
    id = 20;
    params[0] = 1.0;
    RSS(ref_geom_add(ref_grid_geom(ref_grid), node, type, id, params),
        "add node geom");
    node = 2;
    type = REF_GEOM_EDGE;
    id = 20;
    params[0] = 2.0;
    RSS(ref_geom_add(ref_grid_geom(ref_grid), node, type, id, params),
        "add node geom");
    /* add jump? */

    node0 = 1;
    node1 = 4;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "pull to edge?");

    node0 = 4;
    node1 = 1;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_FALSE, allowed, "pull off edge?");

    node0 = 1;
    node1 = 2;
    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    REIS(REF_TRUE, allowed, "parallel along geom edge?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* same normal after collapse? */
    REF_GRID ref_grid;
    REF_INT node;
    REF_INT node0, node1;
    REF_INT nodes[4];
    REF_INT tri1, tri2;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");
    /*
    2---4      y
    |\ 1|\
    |0\ | \    ^
    |  \|2 \   |
    0---1---5  +-> x
    */

    RSS(ref_node_add(ref_grid_node(ref_grid), 4, &node), "add node");
    ref_node_xyz(ref_grid_node(ref_grid), 0, node) = 1.0;
    ref_node_xyz(ref_grid_node(ref_grid), 1, node) = 1.0;
    ref_node_xyz(ref_grid_node(ref_grid), 2, node) = 0.0;

    RSS(ref_node_add(ref_grid_node(ref_grid), 5, &node), "add node");
    ref_node_xyz(ref_grid_node(ref_grid), 0, node) = 2.0;
    ref_node_xyz(ref_grid_node(ref_grid), 1, node) = 0.0;
    ref_node_xyz(ref_grid_node(ref_grid), 2, node) = 0.0;

    nodes[0] = 1;
    nodes[1] = 4;
    nodes[2] = 2;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri1), "add tri");
    nodes[0] = 1;
    nodes[1] = 5;
    nodes[2] = 4;
    nodes[3] = 10;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &tri2), "add tri");

    node0 = 2;
    node1 = 1;
    RSS(ref_collapse_edge_same_normal(ref_grid, node0, node1, &allowed),
        "norm");
    REIS(REF_TRUE, allowed, "normal will be the same");

    ref_node_xyz(ref_grid_node(ref_grid), 2, node) = 0.5;

    RSS(ref_collapse_edge_same_normal(ref_grid, node0, node1, &allowed),
        "norm");
    REIS(REF_FALSE, allowed, "normal would change");

    ref_node_xyz(ref_grid_node(ref_grid), 0, node) = 2.0;
    ref_node_xyz(ref_grid_node(ref_grid), 1, node) = -1.0;
    ref_node_xyz(ref_grid_node(ref_grid), 2, node) = 0.0;

    node0 = 2;
    node1 = 4;
    RSS(ref_collapse_edge_same_normal(ref_grid, node0, node1, &allowed),
        "norm");
    REIS(REF_FALSE, allowed, "tri will have zero area");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* mixed: collapse tet allowed? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");

    REIS(REF_TRUE, allowed, "pure tet allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }
  { /* mixed: collapse of/near mixed allowed? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_fixture_pri_tet_cap_grid(&ref_grid, ref_mpi), "set up");

    node0 = 5;
    node1 = 6;
    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");
    REIS(REF_TRUE, allowed, "tet near mixed allowed?");

    node0 = 6;
    node1 = 5;
    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");
    REIS(REF_FALSE, allowed, "tet changing mixed allowed?");

    node0 = 3;
    node1 = 4;
    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");
    REIS(REF_FALSE, allowed, "mixed collapse allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* local: collapse allowed? */
    REF_GRID ref_grid;
    REF_INT node0, node1;
    REF_BOOL allowed;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_local_cell(ref_grid, node0, node1, &allowed),
        "col loc");
    REIS(REF_TRUE, allowed, "local collapse allowed?");

    ref_node_part(ref_grid_node(ref_grid), 2) =
        ref_node_part(ref_grid_node(ref_grid), 2) + 1;

    node0 = 0;
    node1 = 1;
    RSS(ref_collapse_edge_local_cell(ref_grid, node0, node1, &allowed),
        "col loc");
    REIS(REF_FALSE, allowed, "ghost collapse allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* no collapse, close enough */
    REF_GRID ref_grid;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");

    RSS(ref_collapse_pass(ref_grid), "pass");

    REIS(4, ref_node_n(ref_grid_node(ref_grid)), "nodes");
    REIS(1, ref_cell_n(ref_grid_tet(ref_grid)), "tets");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* top big */
    REF_GRID ref_grid;

    RSS(ref_fixture_tet_grid(&ref_grid, ref_mpi), "set up");

    RSS(ref_node_metric_form(ref_grid_node(ref_grid), 3, 1, 0, 0, 1, 0,
                             1.0 / (10.0 * 10.0)),
        "set top z big");

    RSS(ref_collapse_pass(ref_grid), "pass");

    /* ref_export_by_extension(ref_grid,"ref_collapse_test.tec"); */

    REIS(3, ref_node_n(ref_grid_node(ref_grid)), "nodes");
    REIS(0, ref_cell_n(ref_grid_tet(ref_grid)), "tets");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* edge tangent: collapse allowed? */
    REF_GRID ref_grid;
    REF_INT keep, remove;
    REF_BOOL allowed;

    RSS(ref_fixture_tri2_grid(&ref_grid, ref_mpi), "set up");

    keep = 2;
    remove = 0;
    RSS(ref_collapse_edge_same_tangent(ref_grid, keep, remove, &allowed),
        "same");
    REIS(REF_TRUE, allowed, "straight tangent collapse allowed?");

    ref_node_xyz(ref_grid_node(ref_grid), 1, remove) = 0.5;

    RSS(ref_collapse_edge_same_tangent(ref_grid, keep, remove, &allowed),
        "same");
    REIS(REF_FALSE, allowed, "curved boundary collapse allowed?");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* no collapse, close enough, twod */
    REF_GRID ref_grid;

    RSS(ref_fixture_tri_grid(&ref_grid, ref_mpi), "set up");

    RSS(ref_collapse_pass(ref_grid), "pass");

    REIS(1, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(0, ref_cell_n(ref_grid_qua(ref_grid)), "qua");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  { /* top big, twod */
    REF_GRID ref_grid;

    RSS(ref_fixture_tri_grid(&ref_grid, ref_mpi), "set up");

    RSS(ref_node_metric_form(ref_grid_node(ref_grid), 1, 1, 0, 0,
                             1.0 / (10.0 * 10.0), 0, 1),
        "set top z big");

    RSS(ref_collapse_pass(ref_grid), "pass");

    REIS(2, ref_node_n(ref_grid_node(ref_grid)), "nodes");
    REIS(0, ref_cell_n(ref_grid_tri(ref_grid)), "tri");
    REIS(0, ref_cell_n(ref_grid_pri(ref_grid)), "pri");

    RSS(ref_grid_free(ref_grid), "free grid");
  }

  RSS(ref_mpi_free(ref_mpi), "free");
  RSS(ref_mpi_stop(), "stop");
  return 0;
}